

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void p_ere(parse *p,int stop)

{
  long pos;
  bool bVar1;
  bool bVar2;
  int first;
  sopno conc;
  sopno prevfwd;
  sopno prevback;
  char c;
  int stop_local;
  parse *p_local;
  
  bVar1 = true;
  while( true ) {
    pos = p->slen;
    while( true ) {
      bVar2 = false;
      if (p->next < p->end) {
        bVar2 = false;
        if (*p->next != '|') {
          bVar2 = *p->next != stop;
        }
      }
      if (!bVar2) break;
      p_ere_exp(p);
    }
    if (p->slen == pos) {
      seterr(p,0xe);
    }
    if ((p->end <= p->next) || (*p->next != '|')) break;
    p->next = p->next + 1;
    if (bVar1) {
      doinsert(p,0x3c000000,(p->slen - pos) + 1,pos);
      bVar1 = false;
      conc = pos;
      prevfwd = pos;
    }
    doemit(p,0x40000000,p->slen - prevfwd);
    prevfwd = p->slen + -1;
    dofwd(p,conc,p->slen - conc);
    conc = p->slen;
    doemit(p,0x44000000,0);
  }
  if (!bVar1) {
    dofwd(p,conc,p->slen - conc);
    doemit(p,0x48000000,p->slen - prevfwd);
  }
  if ((p->next < p->end) && ((p->end <= p->next || (*p->next != stop)))) {
    __assert_fail("!MORE() || SEE(stop)",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0xfe,"void p_ere()");
  }
  return;
}

Assistant:

static void
p_ere(p, stop)
struct parse *p;
int stop;			/* character this ERE should end at */
{
	char c;
	sopno prevback;
	sopno prevfwd;
	sopno conc;
	int first = 1;		/* is this the first alternative? */

	for (;;) {
		/* do a bunch of concatenated expressions */
		conc = HERE();
		while (MORE() && (c = PEEK()) != '|' && c != stop)
			p_ere_exp(p);
		REQUIRE(HERE() != conc, REG_EMPTY);	/* require nonempty */

		if (!EAT('|'))
			break;		/* NOTE BREAK OUT */

		if (first) {
			INSERT(OCH_, conc);	/* offset is wrong */
			prevfwd = conc;
			prevback = conc;
			first = 0;
		}
		ASTERN(OOR1, prevback);
		prevback = THERE();
		AHEAD(prevfwd);			/* fix previous offset */
		prevfwd = HERE();
		EMIT(OOR2, 0);			/* offset is very wrong */
	}

	if (!first) {		/* tail-end fixups */
		AHEAD(prevfwd);
		ASTERN(O_CH, prevback);
	}

	assert(!MORE() || SEE(stop));
}